

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_initupvals(lua_State *L,LClosure *cl)

{
  UpVal *pUVar1;
  UpVal *uv;
  int i;
  LClosure *cl_local;
  lua_State *L_local;
  
  for (uv._4_4_ = 0; uv._4_4_ < (int)(uint)cl->nupvalues; uv._4_4_ = uv._4_4_ + 1) {
    pUVar1 = (UpVal *)luaM_realloc_(L,(void *)0x0,0,0x20);
    pUVar1->refcount = 1;
    pUVar1->v = (TValue *)&pUVar1->u;
    pUVar1->v->tt_ = 0;
    cl->upvals[uv._4_4_] = pUVar1;
  }
  return;
}

Assistant:

void luaF_initupvals (lua_State *L, LClosure *cl) {
  int i;
  for (i = 0; i < cl->nupvalues; i++) {
    GCObject *o = luaC_newobj(L, LUA_VUPVAL, sizeof(UpVal));
    UpVal *uv = gco2upv(o);
    uv->v = &uv->u.value;  /* make it closed */
    setnilvalue(uv->v);
    cl->upvals[i] = uv;
    luaC_objbarrier(L, cl, o);
  }
}